

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

void __thiscall QJsonPrivate::Parser::eatBOM(Parser *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  uchar utf8bom [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((3 < *(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 8)) && (**(char **)(in_RDI + 8) == -0x11)
       ) && (*(char *)(*(long *)(in_RDI + 8) + 1) == -0x45)) &&
     (*(char *)(*(long *)(in_RDI + 8) + 2) == -0x41)) {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::eatBOM()
{
    // eat UTF-8 byte order mark
    uchar utf8bom[3] = { 0xef, 0xbb, 0xbf };
    if (end - json > 3 &&
        (uchar)json[0] == utf8bom[0] &&
        (uchar)json[1] == utf8bom[1] &&
        (uchar)json[2] == utf8bom[2])
        json += 3;
}